

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void CVmBifTADS::re_search_common<_1>(uint argc)

{
  vm_globalvar_t *pvVar1;
  undefined4 uVar2;
  int iVar3;
  vm_obj_id_t obj;
  vm_val_t *pvVar4;
  vm_val_t *pvVar5;
  size_t sVar6;
  re_compiled_pattern *pattern;
  CRegexSearcherSimple *this;
  uint in_EDI;
  char *dst;
  char buf [17];
  vm_obj_id_t match_str_obj;
  size_t char_len;
  utf8_ptr matchp;
  size_t char_idx;
  int match_len;
  int match_idx;
  int i;
  size_t len;
  utf8_ptr p;
  char *str;
  vm_val_t pat_val;
  CVmObjPattern *pat_obj;
  char *pat_str;
  int start_idx;
  vm_val_t *v3;
  vm_val_t *v2;
  vm_val_t *v1;
  char *in_stack_fffffffffffffef8;
  CRegexSearcherSimple *in_stack_ffffffffffffff00;
  size_t *in_stack_ffffffffffffff08;
  utf8_ptr *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  CRegexSearcherSimple *entirestr;
  size_t in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 uVar7;
  int in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff50;
  CRegexSearcherSimple *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  utf8_ptr local_80;
  long local_78;
  char local_6c [4];
  int local_68;
  int local_64;
  size_t local_60;
  utf8_ptr local_58;
  char *local_50;
  vm_val_t local_48;
  CVmObject *local_38;
  char *local_30;
  vm_obj_id_t local_24;
  vm_val_t *local_20;
  vm_val_t *local_18;
  vm_val_t *local_10;
  uint local_4;
  
  local_4 = in_EDI;
  CVmBif::check_argc_range
            ((uint)((ulong)in_stack_ffffffffffffff00 >> 0x20),(uint)in_stack_ffffffffffffff00,
             (uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  local_10 = CVmStack::get(0);
  local_18 = CVmStack::get(1);
  if (local_4 < 3) {
    pvVar4 = (vm_val_t *)0x0;
  }
  else {
    pvVar4 = CVmStack::get(2);
  }
  local_20 = pvVar4;
  CVmStack::push(local_18);
  CVmStack::push(local_10);
  local_24 = 0;
  if (local_20 != (vm_val_t *)0x0) {
    if (local_20->typ != VM_INT) {
      err_throw(0);
    }
    local_24 = (local_20->val).obj;
  }
  pvVar1 = G_bif_tads_globals_X->last_rex_str;
  uVar2 = *(undefined4 *)&local_18->field_0x4;
  (pvVar1->val).typ = local_18->typ;
  *(undefined4 *)&(pvVar1->val).field_0x4 = uVar2;
  (pvVar1->val).val = local_18->val;
  CRegexSearcherSimple::clear_group_regs((CRegexSearcherSimple *)0x2a8368);
  local_30 = (char *)0x0;
  local_38 = (CVmObject *)0x0;
  pvVar5 = CVmStack::get(0);
  if (pvVar5->typ == VM_OBJ) {
    CVmStack::get(0);
    iVar3 = CVmObjPattern::is_pattern_obj(0);
    if (iVar3 != 0) {
      CVmStack::pop(&local_48);
      local_38 = vm_objp(0);
      goto LAB_002a83d4;
    }
  }
  local_30 = CVmBif::pop_str_val();
LAB_002a83d4:
  local_50 = CVmBif::pop_str_val();
  utf8_ptr::utf8_ptr((utf8_ptr *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_60 = vmb_get_len((char *)0x2a8407);
  if ((int)local_24 < 0) {
    sVar6 = utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
    iVar3 = (int)sVar6;
  }
  else if (local_24 == 0) {
    sVar6 = utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff40 = (int)sVar6;
    iVar3 = in_stack_ffffffffffffff40;
  }
  else {
    in_stack_ffffffffffffff40 = -1;
    iVar3 = in_stack_ffffffffffffff40;
  }
  local_64 = iVar3 + local_24;
  local_24 = local_64;
  while (uVar7 = 0 < local_64 && local_60 != 0, 0 < local_64 && local_60 != 0) {
    local_64 = local_64 + -1;
    utf8_ptr::inc(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  if (local_38 == (CVmObject *)0x0) {
    in_stack_ffffffffffffff00 = G_bif_tads_globals_X->rex_searcher;
    in_stack_ffffffffffffff08 = (size_t *)(local_30 + 2);
    in_stack_ffffffffffffff10 = (utf8_ptr *)vmb_get_len((char *)0x2a8592);
    utf8_ptr::getptr(&local_58);
    in_stack_fffffffffffffef8 = local_6c;
    local_68 = CRegexSearcherSimple::compile_and_search_back
                         (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(size_t)pvVar4,
                          (char *)CONCAT44(iVar3,in_stack_ffffffffffffff40),
                          (char *)CONCAT17(uVar7,in_stack_ffffffffffffff38),
                          in_stack_ffffffffffffff30,
                          (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else {
    entirestr = G_bif_tads_globals_X->rex_searcher;
    pattern = CVmObjPattern::get_pattern((CVmObjPattern *)0x2a850b);
    this = (CRegexSearcherSimple *)(local_50 + 2);
    utf8_ptr::getptr(&local_58);
    local_68 = CRegexSearcherSimple::search_back_for_pattern
                         (this,pattern,(char *)entirestr,in_stack_ffffffffffffff18,
                          (size_t)in_stack_ffffffffffffff10,(int *)in_stack_ffffffffffffff08);
  }
  if (local_68 < 0) {
    CVmBif::retval_nil();
  }
  else {
    sVar6 = utf8_ptr::s_len((char *)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    local_78 = sVar6 + 1;
    utf8_ptr::getptr(&local_58);
    utf8_ptr::utf8_ptr((utf8_ptr *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
    utf8_ptr::getptr(&local_80);
    obj = CVmObjString::create
                    ((int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                     (char *)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
    pvVar4 = CVmStack::push();
    vm_val_t::set_obj(pvVar4,obj);
    vmb_put_len((char *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
    iVar3 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    put_list_int(&in_stack_ffffffffffffff10->p_,(long)in_stack_ffffffffffffff08);
    put_list_int(&in_stack_ffffffffffffff10->p_,(long)in_stack_ffffffffffffff08);
    put_list_obj(&in_stack_ffffffffffffff10->p_,
                 (vm_obj_id_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    CVmObjList::create(iVar3,in_stack_fffffffffffffef8);
    CVmBif::retval_obj(0);
    CVmStack::discard();
  }
  CVmStack::discard(local_4);
  return;
}

Assistant:

inline void CVmBifTADS::re_search_common(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 2, 3);

    /* 
     *   make copies of the arguments, so we can pop the values without
     *   actually removing them from the stack - leave the originals on the
     *   stack for gc protection 
     */
    vm_val_t *v1 = G_stk->get(0);
    vm_val_t *v2 = G_stk->get(1);
    vm_val_t *v3 = (argc >= 3 ? G_stk->get(2) : 0);
    G_stk->push(v2);
    G_stk->push(v1);

    /* note the starting index, if given */
    int start_idx = (dir > 0 ? 1 : 0);
    if (v3 != 0)
    {
        /* check the type */
        if (v3->typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the value */
        start_idx = (int)v3->val.intval;
    }

    /* 
     *   remember the last search string (the second argument), and clear out
     *   any old group registers (since they'd point into the old string) 
     */
    G_bif_tads_globals->last_rex_str->val = *v2;
    G_bif_tads_globals->rex_searcher->clear_group_regs();

    /* check to see if we have a RexPattern object or an uncompiled string */
    const char *pat_str = 0;
    CVmObjPattern *pat_obj = 0;
    if (G_stk->get(0)->typ == VM_OBJ
        && CVmObjPattern::is_pattern_obj(vmg_ G_stk->get(0)->val.obj))
    {
        vm_val_t pat_val;

        /* get the pattern object */
        G_stk->pop(&pat_val);
        pat_obj = (CVmObjPattern *)vm_objp(vmg_ pat_val.val.obj);
    }
    else
    {
        /* get the pattern string */
        pat_str = pop_str_val(vmg0_);
    }

    /* get the string to search for the pattern */
    const char *str = pop_str_val(vmg0_);
    utf8_ptr p((char *)str + VMB_LEN);
    size_t len = vmb_get_len(str);

    /* if the starting index is negative, it's from the end of the string */
    start_idx += (start_idx < 0 ? (int)p.len(len) :
                  start_idx == 0 && dir < 0 ? (int)p.len(len) :
                  -1);

    /* skip to the starting index */
    for (int i = start_idx ; i > 0 && len != 0 ; --i, p.inc(&len)) ;

    /* search for the pattern */
    int match_idx;
    int match_len;
    if (pat_obj != 0)
    {
        /* try finding the compiled pattern */
        match_idx =
            (dir > 0
             ? G_bif_tads_globals->rex_searcher->search_for_pattern(
                 pat_obj->get_pattern(vmg0_),
                 str + VMB_LEN, p.getptr(), len, &match_len)
             : G_bif_tads_globals->rex_searcher->search_back_for_pattern(
                 pat_obj->get_pattern(vmg0_),
                 str + VMB_LEN, p.getptr(), len, &match_len));
    }
    else
    {
        /* try finding the regular expression string pattern */
        match_idx =
            (dir > 0
             ? G_bif_tads_globals->rex_searcher->compile_and_search(
                 pat_str + VMB_LEN, vmb_get_len(pat_str),
                 str + VMB_LEN, p.getptr(), len, &match_len)
             : G_bif_tads_globals->rex_searcher->compile_and_search_back(
                 pat_str + VMB_LEN, vmb_get_len(pat_str),
                 str + VMB_LEN, p.getptr(), len, &match_len));
    }

    /* check for a match */
    if (match_idx >= 0)
    {
        /* 
         *   We found a match - calculate the character index of the match
         *   offset, adjusted to a 1-base.  The character index is simply the
         *   number of characters in the part of the string up to the match
         *   index.  Note that we have to add the starting index to get the
         *   actual index in the overall string, since 'p' points to the
         *   character at the starting index.  Also note that when searching
         *   backwards, the match index is the number of characters *before*
         *   the starting point.
         */
        size_t char_idx;
        if (dir > 0)
            char_idx = p.len(match_idx) + start_idx + 1;
        else
            char_idx = utf8_ptr::s_len(
                str + VMB_LEN, start_idx - match_idx) + 1;

        /* calculate the character length of the match */
        utf8_ptr matchp(p.getptr() + dir*match_idx);
        size_t char_len = matchp.len(match_len);

        /* allocate a string containing the match */
        vm_obj_id_t match_str_obj =
            CVmObjString::create(vmg_ FALSE, matchp.getptr(), match_len);

        /* push it momentarily as protection against garbage collection */
        G_stk->push()->set_obj(match_str_obj);

        /* 
         *   set up a 3-element list to contain the return value:
         *   [match_start_index, match_length, match_string] 
         */
        char buf[VMB_LEN + VMB_DATAHOLDER * 3];
        vmb_put_len(buf, 3);
        char *dst = buf + VMB_LEN;
        put_list_int(&dst, (long)char_idx);
        put_list_int(&dst, (long)char_len);
        put_list_obj(&dst, match_str_obj);

        /* allocate and return the list */
        retval_obj(vmg_ CVmObjList::create(vmg_ FALSE, buf));

        /* we no longer need the garbage collection protection */
        G_stk->discard();
    }
    else
    {
        /* no match - return nil */
        retval_nil(vmg0_);
    }

    /* discard the arguments */
    G_stk->discard(argc);
}